

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::setNameFilters(QFileDialog *this,QStringList *filters)

{
  QFileDialogPrivate *this_00;
  Ui_QFileDialog *pUVar1;
  QComboBox *this_01;
  bool bVar2;
  long lVar3;
  QString *filter;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  QList<QString>::reserve((QList<QString> *)&local_58,(filters->d).size);
  for (lVar3 = (filters->d).size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    QString::simplified_helper((QString *)&local_70);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  }
  QFileDialogOptions::setNameFilters((QList_conflict *)(this_00->options).value.ptr);
  pUVar1 = (this_00->qFileDialogUi).d;
  if (pUVar1 != (Ui_QFileDialog *)0x0 && (this_00->super_QDialogPrivate).nativeDialogInUse == false)
  {
    QComboBox::clear(pUVar1->fileTypeCombo);
    if (local_58.size != 0) {
      bVar2 = testOption(this,HideNameFilterDetails);
      this_01 = ((this_00->qFileDialogUi).d)->fileTypeCombo;
      if (bVar2) {
        qt_strip_filters((QStringList *)&local_70,(QStringList *)&local_58);
        QComboBox::addItems(this_01,(QStringList *)&local_70);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
      }
      else {
        QComboBox::addItems(this_01,(QStringList *)&local_58);
      }
      QFileDialogPrivate::useNameFilter(this_00,0);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setNameFilters(const QStringList &filters)
{
    Q_D(QFileDialog);
    QStringList cleanedFilters;
    cleanedFilters.reserve(filters.size());
    for (const QString &filter : filters)
        cleanedFilters << filter.simplified();

    d->options->setNameFilters(cleanedFilters);

    if (!d->usingWidgets())
        return;

    d->qFileDialogUi->fileTypeCombo->clear();
    if (cleanedFilters.isEmpty())
        return;

    if (testOption(HideNameFilterDetails))
        d->qFileDialogUi->fileTypeCombo->addItems(qt_strip_filters(cleanedFilters));
    else
        d->qFileDialogUi->fileTypeCombo->addItems(cleanedFilters);

    d->useNameFilter(0);
}